

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::DirectStateAccess::VertexArrays::EnableDisableAttributesTest::PrepareProgram
          (EnableDisableAttributesTest *this,bool bind_even_or_odd)

{
  GLuint GVar1;
  char *pcVar2;
  GLuint i;
  GLuint i_00;
  undefined7 in_register_00000031;
  Utilities *this_00;
  string vs_source;
  string vs_template;
  string copies;
  string declarations;
  allocator<char> local_f5;
  undefined4 local_f4;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"    sum = 0;\n",(allocator<char> *)&local_d0);
  local_f4 = (undefined4)CONCAT71(in_register_00000031,bind_even_or_odd);
  for (this_00 = (Utilities *)(ulong)bind_even_or_odd; (int)this_00 < this->m_max_attributes;
      this_00 = (Utilities *)(ulong)((int)this_00 + 2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"in int a_",(allocator<char> *)&local_b0);
    Utilities::itoa_abi_cxx11_(&local_f0,this_00,i);
    pcVar2 = (char *)std::__cxx11::string::append((string *)&local_d0);
    std::__cxx11::string::append(pcVar2);
    std::__cxx11::string::append((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"    sum += a_",(allocator<char> *)&local_b0);
    Utilities::itoa_abi_cxx11_(&local_f0,this_00,i_00);
    pcVar2 = (char *)std::__cxx11::string::append((string *)&local_d0);
    std::__cxx11::string::append(pcVar2);
    std::__cxx11::string::append((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "#version 450\n\nDECLARATION_TEMPLATEout int sum;\n\nvoid main()\n{\nCOPY_TEMPLATE}\n",
             (allocator<char> *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"DECLARATION_TEMPLATE",(allocator<char> *)&local_70);
  Utilities::replace(&local_f0,&local_d0,&local_b0,&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"COPY_TEMPLATE",&local_f5);
  Utilities::replace(&local_b0,&local_f0,&local_70,&local_90);
  std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  GVar1 = BuildProgram(this,local_f0._M_dataplus._M_p,local_f4._0_1_);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  return GVar1;
}

Assistant:

glw::GLuint EnableDisableAttributesTest::PrepareProgram(const bool bind_even_or_odd)
{
	/* Preprocess vertex shader sources. */
	std::string declarations = "";
	std::string copies		 = "    sum = 0;\n";

	for (glw::GLint i = (glw::GLint)(bind_even_or_odd); i < m_max_attributes; i += 2)
	{
		declarations.append((std::string("in int a_").append(Utilities::itoa(i))).append(";\n"));
		copies.append((std::string("    sum += a_").append(Utilities::itoa(i))).append(";\n"));
	}

	std::string vs_template(s_vertex_shader_template);

	std::string vs_source = Utilities::replace(vs_template, "DECLARATION_TEMPLATE", declarations);
	vs_source			  = Utilities::replace(vs_source, "COPY_TEMPLATE", copies);

	/* Build and compile. */
	return BuildProgram(vs_source.c_str(), bind_even_or_odd);
}